

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O0

int elf_lzma_bit(uchar *compressed,size_t compressed_size,uint16_t *prob,size_t *poffset,
                uint32_t *prange,uint32_t *pcode)

{
  uint uVar1;
  uint uVar2;
  uint32_t bound;
  uint32_t *pcode_local;
  uint32_t *prange_local;
  size_t *poffset_local;
  uint16_t *prob_local;
  size_t compressed_size_local;
  uchar *compressed_local;
  
  elf_lzma_range_normalize(compressed,compressed_size,poffset,prange,pcode);
  uVar2 = (*prange >> 0xb) * (uint)*prob;
  uVar1 = *pcode;
  if (uVar2 <= uVar1) {
    *prange = *prange - uVar2;
    *pcode = *pcode - uVar2;
    *prob = *prob - (short)((int)(uint)*prob >> 5);
  }
  else {
    *prange = uVar2;
    *prob = *prob + (short)(0x800 - *prob >> 5);
  }
  compressed_local._4_4_ = (uint)(uVar2 <= uVar1);
  return compressed_local._4_4_;
}

Assistant:

static int
elf_lzma_bit (const unsigned char *compressed, size_t compressed_size,
	      uint16_t *prob, size_t *poffset, uint32_t *prange,
	      uint32_t *pcode)
{
  uint32_t bound;

  elf_lzma_range_normalize (compressed, compressed_size, poffset,
			    prange, pcode);
  bound = (*prange >> 11) * (uint32_t) *prob;
  if (*pcode < bound)
    {
      *prange = bound;
      *prob += ((1U << 11) - *prob) >> 5;
      return 0;
    }
  else
    {
      *prange -= bound;
      *pcode -= bound;
      *prob -= *prob >> 5;
      return 1;
    }
}